

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O3

void applyCoeffs(gdImagePtr src,gdImagePtr dst,double *coeffs,int radius,gdAxis axis)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int **ppiVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint *puVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  auVar9 = _DAT_00125cb0;
  iVar2 = src->red[(ulong)(axis == HORIZONTAL) - 3];
  if (0 < (long)iVar2) {
    uVar3 = src->red[(ulong)(axis != HORIZONTAL) - 3];
    iVar11 = -radius;
    uVar19 = 0;
    do {
      if (0 < (int)uVar3) {
        ppiVar4 = dst->tpixels;
        uVar10 = 0;
        lVar15 = (long)iVar11;
        iVar17 = iVar11;
        do {
          uVar12 = uVar19;
          uVar8 = uVar10;
          if (axis == HORIZONTAL) {
            uVar12 = uVar10;
            uVar8 = uVar19;
          }
          if (radius < 0) {
            dVar25 = 0.0;
            dVar26 = 0.0;
            dVar5 = 0.0;
            dVar6 = 0.0;
          }
          else {
            dVar25 = 0.0;
            dVar26 = 0.0;
            lVar13 = 0;
            dVar5 = 0.0;
            dVar6 = 0.0;
            lVar21 = (long)iVar11;
            do {
              uVar22 = (int)uVar10 + (int)lVar21;
              if (lVar15 + lVar13 < 0) {
                iVar23 = -uVar22;
              }
              else if (lVar15 + lVar13 < (long)(ulong)uVar3) {
                iVar23 = iVar17 + (int)lVar13;
              }
              else {
                iVar23 = ~uVar22 + uVar3 * 2;
              }
              if (axis == HORIZONTAL) {
                puVar24 = (uint *)(src->tpixels[uVar19] + iVar23);
              }
              else {
                puVar24 = (uint *)(src->tpixels[iVar23] + uVar19);
              }
              dVar1 = coeffs[lVar13];
              uVar22 = *puVar24;
              dVar25 = dVar25 + (double)(uVar22 & 0xff) * dVar1;
              dVar26 = dVar26 + (double)(uVar22 >> 8 & 0xff) * dVar1;
              dVar5 = dVar5 + dVar1 * (double)(uVar22 >> 0x10 & 0xff);
              dVar6 = dVar6 + dVar1 * (double)(uVar22 >> 0x18 & 0x7f);
              lVar21 = lVar21 + 1;
              lVar13 = lVar13 + 1;
            } while (radius * 2 + 1 != (int)lVar13);
          }
          uVar22 = 0x7f;
          if (dVar6 < 0.0) {
            uVar22 = 0;
          }
          uVar20 = 0xff;
          if (dVar5 < 0.0) {
            uVar20 = 0;
          }
          uVar14 = 0xff;
          if (dVar26 < 0.0) {
            uVar14 = 0;
          }
          auVar27._0_4_ = (int)(dVar25 + 0.5) << 0x10;
          auVar27._4_4_ = (int)(dVar26 + 0.5) << 0x10;
          auVar27._8_4_ = (int)(dVar5 + 0.5) << 0x10;
          auVar27._12_4_ = (int)(dVar6 + 0.5) << 0x10;
          auVar27 = auVar27 ^ auVar9;
          auVar28._0_2_ = -(ushort)(-0x7f01 < auVar27._0_2_);
          auVar28._2_2_ = -(ushort)(-0x7f01 < auVar27._2_2_);
          auVar28._4_2_ = -(ushort)(-0x7f01 < auVar27._4_2_);
          auVar28._6_2_ = -(ushort)(-0x7f01 < auVar27._6_2_);
          auVar28._8_2_ = -(ushort)(-0x7f01 < auVar27._8_2_);
          auVar28._10_2_ = -(ushort)(-0x7f01 < auVar27._10_2_);
          auVar28._12_2_ = -(ushort)(-0x7f81 < auVar27._12_2_);
          auVar28._14_2_ = -(ushort)(-0x7f81 < auVar27._14_2_);
          uVar18 = movmskps(uVar3 * 2,auVar28);
          uVar16 = (int)(dVar6 + 0.5) & 0xffff;
          if ((uVar18 & 8) != 0) {
            uVar16 = uVar22;
          }
          uVar22 = (int)(dVar5 + 0.5) & 0xffff;
          if ((uVar18 & 4) != 0) {
            uVar22 = uVar20;
          }
          uVar20 = (int)(dVar26 + 0.5) & 0xffff;
          if ((uVar18 & 2) != 0) {
            uVar20 = uVar14;
          }
          uVar14 = 0xff;
          if (dVar25 < 0.0) {
            uVar14 = 0;
          }
          uVar7 = (int)(dVar25 + 0.5);
          if ((uVar18 & 1) != 0) {
            uVar7 = uVar14;
          }
          ppiVar4[uVar8][uVar12] =
               uVar7 & 0xff | (uVar20 & 0xff) << 8 | (uVar22 & 0xff) << 0x10 | uVar16 << 0x18;
          uVar10 = uVar10 + 1;
          lVar15 = lVar15 + 1;
          iVar17 = iVar17 + 1;
        } while (uVar10 != uVar3);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (long)iVar2);
  }
  return;
}

Assistant:

static void
applyCoeffs(gdImagePtr src, gdImagePtr dst, double *coeffs, int radius, 
            gdAxis axis)
{
    int line, numlines, linelen;

    if (axis == HORIZONTAL) {
        numlines = src->sy;
        linelen = src->sx;
    } else {
        numlines = src->sx;
        linelen = src->sy;
    }/* if .. else*/

    for (line = 0; line < numlines; line++) {
        applyCoeffsLine(src, dst, line, linelen, coeffs, radius, axis);
    }/* for */
}